

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_read_double(char **data,double *ret)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool local_51;
  char *pcStack_40;
  uint8_t c;
  char *p;
  double val;
  uint64_t uval;
  int64_t ival;
  double *ret_local;
  char **data_local;
  
  pcStack_40 = *data;
  ival = (int64_t)ret;
  ret_local = (double *)data;
  bVar1 = mp_load_u8(&stack0xffffffffffffffc0);
  uVar2 = bVar1 - 0xca;
  if (uVar2 < 9 || bVar1 == 0xd3) {
    iVar3 = (*(code *)(&DAT_0012dea0 + *(int *)(&DAT_0012dea0 + (ulong)uVar2 * 4)))();
    return iVar3;
  }
  local_51 = (char)bVar1 < -0x20;
  if (local_51) {
    data_local._4_4_ = -1;
  }
  else {
    *(double *)ival = (double)(int)(char)bVar1;
    *ret_local = (double)pcStack_40;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL int
mp_read_double(const char **data, double *ret)
{
	int64_t ival;
	uint64_t uval;
	double val;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t) mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t) mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t) mp_load_u32(&p);
		break;
	case 0xd3:
		ival = (int64_t) mp_load_u64(&p);
		val = (double) ival;
		if ((int64_t)val != ival)
			return -1;
		*ret = val;
		break;
	case 0xcc:
		*ret = mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = mp_load_u16(&p);
		break;
	case 0xce:
		*ret = mp_load_u32(&p);
		break;
	case 0xcf:
		uval = mp_load_u64(&p);
		val = (double)uval;
		if ((uint64_t)val != uval)
			return -1;
		*ret = val;
		break;
	case 0xca:
		*ret = mp_load_float(&p);
		break;
	case 0xcb:
		*ret = mp_load_double(&p);
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}